

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::eval_or(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  ParserFail *this;
  bool local_a1;
  allocator local_89;
  string local_88 [48];
  Bytes local_58;
  Bytes local_48;
  Read<signed_char> local_38;
  bool local_21;
  any *local_20;
  any *rhs_local;
  any *lhs_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local = __return_storage_ptr__;
  ptVar2 = any::type(lhs);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&bool::typeinfo);
  if (bVar1) {
    bVar1 = any_cast<bool>(rhs_local);
    local_a1 = true;
    if (!bVar1) {
      local_a1 = any_cast<bool>(local_20);
    }
    local_21 = local_a1;
    any::any<bool,void>(__return_storage_ptr__,&local_21);
  }
  else {
    ptVar2 = any::type(rhs_local);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<signed_char>::typeinfo);
    if (!bVar1) {
      this = (ParserFail *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Invalid operand types to || operator",&local_89);
      ParserFail::ParserFail(this,(string *)local_88);
      __cxa_throw(this,&ParserFail::typeinfo,ParserFail::~ParserFail);
    }
    any_cast<Omega_h::Read<signed_char>>((Omega_h *)&local_48,rhs_local);
    any_cast<Omega_h::Read<signed_char>>((Omega_h *)&local_58,local_20);
    lor_each((Omega_h *)&local_38,&local_48,&local_58);
    any::any<Omega_h::Read<signed_char>,void>(__return_storage_ptr__,&local_38);
    Read<signed_char>::~Read(&local_38);
    Read<signed_char>::~Read(&local_58);
    Read<signed_char>::~Read(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

any eval_or(any& lhs, any& rhs) {
  if (lhs.type() == typeid(bool)) {
    return any_cast<bool>(lhs) || any_cast<bool>(rhs);
  } else if (lhs.type() == typeid(Bytes)) {
    return lor_each(any_cast<Bytes>(lhs), any_cast<Bytes>(rhs));
  } else {
    throw ParserFail("Invalid operand types to || operator");
  }
}